

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O1

TProb<double> * __thiscall
libDAI::TProb<double>::operator*
          (TProb<double> *__return_storage_ptr__,TProb<double> *this,TProb<double> *q)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  long lVar4;
  
  std::vector<double,_std::allocator<double>_>::vector(&__return_storage_ptr__->_p,&this->_p);
  pdVar1 = (__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(__return_storage_ptr__->_p).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    pdVar2 = (q->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      pdVar1[lVar4] = pdVar2[lVar4] * pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

TProb<T> operator* (const TProb<T> & q) const {
#ifdef DEBUG
                assert( size() == q.size() );
#endif
                TProb<T> prod( *this );
                prod *= q;
                return prod;
            }